

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwMaximizeWindow(GLFWwindow *handle)

{
  long *plVar1;
  undefined8 uVar2;
  long lVar3;
  Atom AVar4;
  long lVar5;
  ulong uVar6;
  _GLFWwindow *window;
  ulong uVar7;
  undefined1 auStack_104 [4];
  long lStack_100;
  undefined1 auStack_f8 [8];
  long lStack_f0;
  undefined8 uStack_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined8 uStack_c8;
  Atom AStack_c0;
  undefined4 uStack_b8;
  undefined8 uStack_b0;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 uStack_98;
  int iStack_8c;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if (*(long *)(handle + 0x48) == 0) {
    if (((_glfw.x11.NET_WM_STATE != 0) &&
        (CONCAT44(_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT._4_4_,
                  (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT) != 0)) &&
       (CONCAT44(_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ._4_4_,
                 (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ) != 0)) {
      XGetWindowAttributes(_glfw.x11.display,*(undefined8 *)(handle + 0x350),&uStack_e8);
      AVar4 = _glfw.x11.NET_WM_STATE;
      if (iStack_8c == 2) {
        uVar2 = *(undefined8 *)(handle + 0x350);
        memset(&uStack_e8,0,0xc0);
        uStack_e8._0_4_ = 0x21;
        uStack_b8 = 0x20;
        AStack_c0 = AVar4;
        uStack_b0 = 1;
        uStack_a8 = (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
        uStack_a4 = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT._4_4_;
        uStack_a0 = (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
        uStack_9c = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ._4_4_;
        uStack_98 = 1;
        uStack_c8 = uVar2;
        XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,&uStack_e8);
      }
      else {
        lStack_100 = 0;
        XGetWindowProperty(_glfw.x11.display,*(undefined8 *)(handle + 0x350),_glfw.x11.NET_WM_STATE,
                           0,0x7fffffffffffffff,0,4,&uStack_e8,auStack_104,&lStack_f0,auStack_f8,
                           &lStack_100);
        uStack_e8._0_4_ = (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
        uStack_e8._4_4_ = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT._4_4_;
        uStack_e0 = (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
        uStack_dc = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ._4_4_;
        uVar7 = 2;
        if (lStack_f0 != 0) {
          lVar5 = 0;
          do {
            if (uVar7 == 0) {
              uVar7 = 0;
            }
            else {
              lVar3 = *(long *)(lStack_100 + lVar5 * 8);
              uVar6 = 0;
              do {
                if (lVar3 == (&uStack_e8)[uVar6]) {
                  plVar1 = &lStack_f0 + uVar7;
                  uVar7 = uVar7 - 1;
                  (&uStack_e8)[uVar6] = *plVar1;
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 < uVar7);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != lStack_f0);
        }
        if (lStack_100 != 0) {
          XFree();
        }
        if (uVar7 == 0) {
          return;
        }
        XChangeProperty(_glfw.x11.display,*(undefined8 *)(handle + 0x350),_glfw.x11.NET_WM_STATE,4,
                        0x20,2,&uStack_e8,uVar7);
      }
      XFlush(_glfw.x11.display);
    }
    return;
  }
  return;
}

Assistant:

GLFWAPI void glfwMaximizeWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformMaximizeWindow(window);
}